

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

Value * __thiscall
Json::Path::resolve(Value *__return_storage_ptr__,Path *this,Value *root,Value *defaultValue)

{
  bool bVar1;
  reference key;
  Value *pVVar2;
  PathArgument *arg;
  const_iterator __end1;
  const_iterator __begin1;
  Args *__range1;
  Value *node;
  Value *defaultValue_local;
  Value *root_local;
  Path *this_local;
  
  __end1 = std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::begin(&this->args_)
  ;
  arg = (PathArgument *)
        std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::end(&this->args_);
  __range1 = (Args *)root;
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                                *)&arg);
    if (!bVar1) {
      Value::Value(__return_storage_ptr__,(Value *)__range1);
      return __return_storage_ptr__;
    }
    key = __gnu_cxx::
          __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
          ::operator*(&__end1);
    if (key->kind_ == kindIndex) {
      bVar1 = Value::isArray((Value *)__range1);
      if ((!bVar1) || (bVar1 = Value::isValidIndex((Value *)__range1,key->index_), !bVar1)) {
        Value::Value(__return_storage_ptr__,defaultValue);
        return __return_storage_ptr__;
      }
      __range1 = (Args *)Value::operator[]((Value *)__range1,key->index_);
    }
    else if (key->kind_ == kindKey) {
      bVar1 = Value::isObject((Value *)__range1);
      if (!bVar1) {
        Value::Value(__return_storage_ptr__,defaultValue);
        return __return_storage_ptr__;
      }
      __range1 = (Args *)Value::operator[]((Value *)__range1,&key->key_);
      pVVar2 = Value::nullSingleton();
      if ((Value *)__range1 == pVVar2) {
        Value::Value(__return_storage_ptr__,defaultValue);
        return __return_storage_ptr__;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

Value Path::resolve(const Value& root, const Value& defaultValue) const {
  const Value* node = &root;
  for (const auto& arg : args_) {
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_))
        return defaultValue;
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject())
        return defaultValue;
      node = &((*node)[arg.key_]);
      if (node == &Value::nullSingleton())
        return defaultValue;
    }
  }
  return *node;
}